

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaItemListPtr xmlSchemaItemListCreate(void)

{
  xmlSchemaItemListPtr pxVar1;
  
  pxVar1 = (xmlSchemaItemListPtr)(*xmlMalloc)(0x10);
  if (pxVar1 == (xmlSchemaItemListPtr)0x0) {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
  }
  else {
    pxVar1->items = (void **)0x0;
    pxVar1->nbItems = 0;
    pxVar1->sizeItems = 0;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaItemListPtr
xmlSchemaItemListCreate(void)
{
    xmlSchemaItemListPtr ret;

    ret = xmlMalloc(sizeof(xmlSchemaItemList));
    if (ret == NULL) {
	xmlSchemaPErrMemory(NULL);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaItemList));
    return (ret);
}